

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_RingModulator.cpp
# Opt level: O1

int RingModulator::CreateCallback(UnityAudioEffectState *state)

{
  float *params;
  
  params = (float *)operator_new(0x10);
  params[0] = 0.0;
  params[1] = 0.0;
  params[2] = 0.0;
  params[3] = 0.0;
  params[3] = 1.0;
  (state->field_0).field_0.effectdata = params;
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,params);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* effectdata = new EffectData;
        memset(effectdata, 0, sizeof(EffectData));
        effectdata->data.c = 1.0f;
        state->effectdata = effectdata;
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, effectdata->data.p);
        return UNITY_AUDIODSP_OK;
    }